

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_DetachItemFromObject(cJSON *object,char *string)

{
  cJSON *pcVar1;
  
  pcVar1 = cJSON_GetObjectItem(object,string);
  pcVar1 = cJSON_DetachItemViaPointer(object,pcVar1);
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_DetachItemFromObject(cJSON *object, const char *string)
{
    cJSON *to_detach = cJSON_GetObjectItem(object, string);

    return cJSON_DetachItemViaPointer(object, to_detach);
}